

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

PrimInfoMB * __thiscall
embree::avx512::LineSegmentsISA::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,LineSegmentsISA *this,mvector<PrimRefMB> *prims,
          BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint *puVar1;
  byte *pbVar2;
  undefined1 *puVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  BBox1f BVar8;
  BufferView<embree::Vec3fx> *pBVar9;
  char *pcVar10;
  PrimRefMB *pPVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar16;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar17;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  size_t *psVar22;
  long unaff_RBX;
  uint uVar24;
  int iVar25;
  long lVar26;
  PrimInfoMB *pPVar27;
  long lVar28;
  uint uVar29;
  long lVar30;
  long lVar31;
  ulong uVar32;
  uint index;
  size_t sVar33;
  ulong uVar34;
  int iVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar56;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar58;
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar63;
  undefined1 auVar64 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar65;
  undefined1 auVar66 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar67;
  undefined1 auVar68 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar69;
  undefined1 auVar70 [64];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [16];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  ulong local_78;
  unsigned_long local_70;
  size_t local_68;
  size_t local_60;
  ulong uVar23;
  undefined1 auVar57 [64];
  undefined1 auVar59 [64];
  
  aVar56.m128[2] = INFINITY;
  aVar56._0_8_ = 0x7f8000007f800000;
  aVar56.m128[3] = INFINITY;
  auVar57 = ZEXT1664((undefined1  [16])aVar56);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar56;
  aVar58.m128[2] = -INFINITY;
  aVar58._0_8_ = 0xff800000ff800000;
  aVar58.m128[3] = -INFINITY;
  auVar59 = ZEXT1664((undefined1  [16])aVar58);
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar56;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar56;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar58;
  (__return_storage_ptr__->object_range)._begin = 0;
  (__return_storage_ptr__->object_range)._end = 0;
  __return_storage_ptr__->num_time_segments = 0;
  __return_storage_ptr__->max_num_time_segments = 0;
  (__return_storage_ptr__->max_time_range).lower = 0.0;
  auVar37._8_4_ = 0x3f800000;
  auVar37._0_8_ = &DAT_3f8000003f800000;
  auVar37._12_4_ = 0x3f800000;
  uVar7 = vmovlps_avx(auVar37);
  *(undefined8 *)&(__return_storage_ptr__->max_time_range).upper = uVar7;
  (__return_storage_ptr__->time_range).upper = 0.0;
  uVar32 = r->_begin;
  auVar39._8_8_ = 0;
  auVar39._0_4_ = (__return_storage_ptr__->time_range).lower;
  auVar39._4_4_ = (__return_storage_ptr__->time_range).upper;
  auVar62 = ZEXT1664(auVar39);
  local_68 = __return_storage_ptr__->num_time_segments;
  local_78 = __return_storage_ptr__->max_num_time_segments;
  auVar61 = ZEXT464((uint)(__return_storage_ptr__->max_time_range).lower);
  auVar60 = ZEXT464((uint)(__return_storage_ptr__->max_time_range).upper);
  aVar69 = aVar56;
  aVar67 = aVar58;
  aVar65 = aVar56;
  aVar63 = aVar58;
  if (uVar32 < r->_end) {
    auVar75 = ZEXT464(geomID);
    local_70 = (__return_storage_ptr__->object_range)._end;
    auVar73 = ZEXT464(0x3f800002);
    auVar72 = ZEXT816(0) << 0x40;
    auVar76 = ZEXT464(0x3f800000);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0xddccb9a2));
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x5dccb9a2));
    auVar70 = ZEXT1664((undefined1  [16])aVar56);
    auVar68 = ZEXT1664((undefined1  [16])aVar58);
    auVar66 = ZEXT1664((undefined1  [16])aVar56);
    auVar64 = ZEXT1664((undefined1  [16])aVar58);
    pPVar27 = __return_storage_ptr__;
    local_60 = k;
    do {
      auVar41._8_8_ = 0;
      auVar41._0_4_ = (this->super_LineSegments).super_Geometry.time_range.lower;
      auVar41._4_4_ = (this->super_LineSegments).super_Geometry.time_range.upper;
      fVar71 = t0t1->lower;
      fVar4 = t0t1->upper;
      auVar39 = vsubss_avx512f(ZEXT416((uint)fVar71),auVar41);
      auVar40 = vmovshdup_avx512vl(auVar41);
      auVar40 = vsubss_avx512f(auVar40,auVar41);
      auVar39 = vdivss_avx512f(auVar39,auVar40);
      auVar41 = vsubss_avx512f(ZEXT416((uint)fVar4),auVar41);
      auVar40 = vdivss_avx512f(auVar41,auVar40);
      auVar41 = auVar73._0_16_;
      auVar39 = vmulss_avx512f(auVar39,auVar41);
      lVar28 = *(long *)&(this->super_LineSegments).super_Geometry.field_0x58;
      uVar21 = *(uint *)(lVar28 + *(long *)&(this->super_LineSegments).field_0x68 * uVar32);
      psVar22 = (size_t *)(this->super_LineSegments).vertices.items;
      if ((ulong)(uVar21 + 1) < ((RawBufferView *)(psVar22 + 3))->ptr_ofs) {
        fVar5 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
        auVar39 = vmulss_avx512f(ZEXT416((uint)fVar5),auVar39);
        auVar39 = vrndscaless_avx512f(auVar39,auVar39);
        puVar1 = (uint *)((long)&(((BufferView<embree::Vec3fx> *)(psVar22 + 0xfffffffffffffff2))->
                                 super_RawBufferView).stride + 1);
        *puVar1 = *puVar1 | (uint)&stack0xffffffffffffffd0;
        pbVar2 = (byte *)((long)&pPVar27[-1].max_num_time_segments + 5);
        *pbVar2 = *pbVar2 | (byte)unaff_RBX;
        uVar24 = vcvttss2si_avx512f(auVar39);
        auVar39 = vmulss_avx512f(ZEXT416((uint)fVar5),ZEXT416((uint)(auVar40._0_4_ * 0.99999976)));
        auVar39 = vroundss_avx(auVar39,auVar39,10);
        auVar40 = ZEXT416((uint)fVar5);
        auVar39 = vminss_avx512f(auVar39,auVar40);
        uVar29 = (uint)auVar39._0_4_;
        bVar36 = uVar29 < uVar24;
        if (uVar24 <= uVar29) {
          uVar34 = (ulong)(int)uVar24;
          unaff_RBX = *(long *)&((BufferView<embree::Vec3fx> *)(psVar22 + uVar34 * 7))->
                                super_RawBufferView;
          sVar33 = (((BufferView<embree::Vec3fx> *)(psVar22 + uVar34 * 7))->super_RawBufferView).
                   stride;
          lVar26 = sVar33 * uVar21;
          auVar39 = *(undefined1 (*) [16])(unaff_RBX + lVar26);
          uVar7 = vcmpps_avx512vl(auVar39,auVar37,6);
          uVar15 = vcmpps_avx512vl(auVar39,auVar38,1);
          uVar24 = (uint)uVar7 & (uint)uVar15;
          pPVar27 = (PrimInfoMB *)CONCAT44((int)((ulong)lVar26 >> 0x20),uVar24);
          if ((char)uVar24 == '\x0f') {
            psVar22 = &(((BufferView<embree::Vec3fx> *)(psVar22 + (uVar34 + 1) * 7))->
                       super_RawBufferView).stride;
            do {
              auVar42 = *(undefined1 (*) [16])(unaff_RBX + sVar33 * (uVar21 + 1));
              uVar7 = vcmpps_avx512vl(auVar42,auVar37,6);
              uVar15 = vcmpps_avx512vl(auVar42,auVar38,1);
              uVar24 = (uint)uVar7 & (uint)uVar15;
              pPVar27 = (PrimInfoMB *)CONCAT44((int)((ulong)pPVar27 >> 0x20),uVar24);
              if ((char)uVar24 != '\x0f') break;
              auVar39 = vshufps_avx(auVar39,auVar39,0xff);
              auVar42 = vshufps_avx512vl(auVar42,auVar42,0xff);
              auVar39 = vminss_avx512f(auVar39,auVar42);
              if (auVar39._0_4_ < 0.0) break;
              uVar34 = uVar34 + 1;
              bVar36 = (ulong)(long)(int)uVar29 < uVar34;
              if ((ulong)(long)(int)uVar29 < uVar34) goto LAB_01fb1678;
              unaff_RBX = *(long *)&(((BufferView<embree::Vec3fx> *)(psVar22 + 0xfffffffffffffff9))
                                    ->super_RawBufferView).modified;
              sVar33 = *psVar22;
              psVar22 = psVar22 + 7;
              lVar26 = sVar33 * uVar21;
              auVar39 = *(undefined1 (*) [16])(unaff_RBX + lVar26);
              uVar7 = vcmpps_avx512vl(auVar39,auVar37,6);
              uVar15 = vcmpps_avx512vl(auVar39,auVar38,1);
              uVar24 = (uint)uVar7 & (uint)uVar15;
              pPVar27 = (PrimInfoMB *)CONCAT44((int)((ulong)lVar26 >> 0x20),uVar24);
            } while ((char)uVar24 == '\x0f');
          }
          if (!bVar36) goto LAB_01fb1c13;
        }
LAB_01fb1678:
        fVar6 = (this->super_LineSegments).super_Geometry.time_range.lower;
        auVar39 = vsubss_avx512f(ZEXT416((uint)fVar71),ZEXT416((uint)fVar6));
        auVar42 = vsubss_avx512f(ZEXT416((uint)(this->super_LineSegments).super_Geometry.time_range.
                                               upper),ZEXT416((uint)fVar6));
        auVar39 = vdivss_avx512f(auVar39,auVar42);
        auVar43 = vsubss_avx512f(ZEXT416((uint)fVar4),ZEXT416((uint)fVar6));
        auVar42 = vdivss_avx512f(auVar43,auVar42);
        auVar43 = vmulss_avx512f(auVar40,auVar39);
        auVar44 = vmulss_avx512f(auVar40,auVar42);
        auVar45 = vrndscaless_avx512f(auVar43,auVar43);
        puVar3 = &(((BufferView<embree::Vec3fx> *)(psVar22 + 0xffffffffffffffeb))->
                  super_RawBufferView).field_0x2b;
        *(uint *)puVar3 = *(uint *)puVar3 | (uint)&stack0xffffffffffffffd0;
        r = (range<unsigned_long> *)(ulong)((int)r + 0xf51df600);
        auVar46 = vmaxss_avx512f(auVar45,auVar72);
        auVar40 = vminss_avx512f(ZEXT416((uint)fVar4),auVar40);
        iVar20 = vcvttss2si_avx512f(auVar46);
        iVar25 = vcvttss2si_avx512f(auVar40);
        iVar19 = (int)auVar45._0_4_;
        if ((int)auVar45._0_4_ < 0) {
          iVar19 = -1;
        }
        uVar24 = vcvttss2si_avx512f(ZEXT416((uint)fVar4));
        iVar35 = vcvttss2si_avx512f(ZEXT416((uint)fVar5));
        uVar21 = iVar35 + 1U;
        if ((int)uVar24 < (int)(iVar35 + 1U)) {
          uVar21 = uVar24;
        }
        lVar26 = (long)iVar20;
        uVar24 = *(uint *)(lVar28 + *(long *)&(this->super_LineSegments).field_0x68 * uVar32);
        uVar34 = (ulong)uVar24;
        pBVar9 = (this->super_LineSegments).vertices.items;
        pcVar10 = pBVar9[lVar26].super_RawBufferView.ptr_ofs;
        sVar33 = pBVar9[lVar26].super_RawBufferView.stride;
        lVar30 = sVar33 * uVar34;
        uVar23 = (ulong)(uVar24 + 1);
        lVar28 = sVar33 * uVar23;
        auVar45 = vminps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar30),
                                  *(undefined1 (*) [16])(pcVar10 + lVar28));
        auVar47 = vmaxps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar30),
                                  *(undefined1 (*) [16])(pcVar10 + lVar28));
        fVar71 = (this->super_LineSegments).maxRadiusScale;
        auVar48 = vmaxss_avx512f(ZEXT416(*(uint *)(pcVar10 + lVar28 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar10 + lVar30 + 0xc)));
        auVar48 = vmulss_avx512f(ZEXT416((uint)fVar71),auVar48);
        auVar48 = vbroadcastss_avx512vl(auVar48);
        auVar45 = vsubps_avx512vl(auVar45,auVar48);
        auVar47 = vaddps_avx512vl(auVar47,auVar48);
        lVar28 = (long)iVar25;
        pcVar10 = pBVar9[lVar28].super_RawBufferView.ptr_ofs;
        sVar33 = pBVar9[lVar28].super_RawBufferView.stride;
        lVar31 = sVar33 * uVar34;
        lVar30 = sVar33 * uVar23;
        auVar48 = vminps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar31),
                                  *(undefined1 (*) [16])(pcVar10 + lVar30));
        auVar49 = vmaxps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar31),
                                  *(undefined1 (*) [16])(pcVar10 + lVar30));
        auVar50 = vmaxss_avx512f(ZEXT416(*(uint *)(pcVar10 + lVar30 + 0xc)),
                                 ZEXT416(*(uint *)(pcVar10 + lVar31 + 0xc)));
        auVar50 = vmulss_avx512f(ZEXT416((uint)fVar71),auVar50);
        auVar50 = vbroadcastss_avx512vl(auVar50);
        auVar48 = vsubps_avx512vl(auVar48,auVar50);
        auVar49 = vaddps_avx512vl(auVar49,auVar50);
        auVar50 = auVar76._0_16_;
        if (uVar21 - iVar19 == 1) {
          auVar39 = vsubss_avx512f(auVar43,auVar46);
          auVar39 = vmaxss_avx(auVar39,auVar72);
          auVar41 = vsubss_avx512f(auVar50,auVar39);
          auVar42._0_4_ = auVar39._0_4_;
          auVar42._4_4_ = auVar42._0_4_;
          auVar42._8_4_ = auVar42._0_4_;
          auVar42._12_4_ = auVar42._0_4_;
          auVar39 = vmulps_avx512vl(auVar42,auVar48);
          auVar41 = vbroadcastss_avx512vl(auVar41);
          auVar51 = vfmadd231ps_avx512vl(auVar39,auVar41,auVar45);
          auVar39 = vmulps_avx512vl(auVar42,auVar49);
          auVar46 = vfmadd231ps_avx512vl(auVar39,auVar47,auVar41);
          auVar39 = vsubss_avx512f(auVar40,auVar44);
          auVar39 = vmaxss_avx512f(auVar39,auVar72);
          auVar40 = vsubss_avx512f(auVar50,auVar39);
          auVar39 = vbroadcastss_avx512vl(auVar39);
          auVar41 = vmulps_avx512vl(auVar39,auVar45);
          auVar40 = vbroadcastss_avx512vl(auVar40);
          auVar43 = vfmadd213ps_avx512vl(auVar48,auVar40,auVar41);
          auVar39 = vmulps_avx512vl(auVar39,auVar47);
          auVar40 = vfmadd213ps_avx512vl(auVar49,auVar40,auVar39);
        }
        else {
          pcVar10 = pBVar9[lVar26 + 1].super_RawBufferView.ptr_ofs;
          sVar33 = pBVar9[lVar26 + 1].super_RawBufferView.stride;
          lVar30 = sVar33 * uVar34;
          lVar26 = sVar33 * uVar23;
          auVar51 = vminps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar30),
                                    *(undefined1 (*) [16])(pcVar10 + lVar26));
          auVar52 = vmaxps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar30),
                                    *(undefined1 (*) [16])(pcVar10 + lVar26));
          auVar53 = vmaxss_avx512f(ZEXT416(*(uint *)(pcVar10 + lVar26 + 0xc)),
                                   ZEXT416(*(uint *)(pcVar10 + lVar30 + 0xc)));
          auVar74 = ZEXT416((uint)fVar71);
          auVar53 = vmulss_avx512f(auVar74,auVar53);
          auVar53 = vbroadcastss_avx512vl(auVar53);
          auVar51 = vsubps_avx512vl(auVar51,auVar53);
          auVar52 = vaddps_avx512vl(auVar52,auVar53);
          pcVar10 = pBVar9[lVar28 + -1].super_RawBufferView.ptr_ofs;
          sVar33 = pBVar9[lVar28 + -1].super_RawBufferView.stride;
          lVar26 = sVar33 * uVar34;
          lVar28 = sVar33 * uVar23;
          auVar53 = vminps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar26),
                                    *(undefined1 (*) [16])(pcVar10 + lVar28));
          auVar54 = vmaxps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar26),
                                    *(undefined1 (*) [16])(pcVar10 + lVar28));
          auVar55 = vmaxss_avx512f(ZEXT416(*(uint *)(pcVar10 + lVar28 + 0xc)),
                                   ZEXT416(*(uint *)(pcVar10 + lVar26 + 0xc)));
          auVar55 = vmulss_avx512f(auVar74,auVar55);
          auVar55 = vbroadcastss_avx512vl(auVar55);
          auVar53 = vsubps_avx512vl(auVar53,auVar55);
          auVar54 = vaddps_avx512vl(auVar54,auVar55);
          auVar76 = ZEXT1664(auVar50);
          auVar43 = vsubss_avx512f(auVar43,auVar46);
          auVar43 = vmaxss_avx512f(auVar43,auVar72);
          auVar46 = vsubss_avx512f(auVar50,auVar43);
          auVar43 = vbroadcastss_avx512vl(auVar43);
          auVar51 = vmulps_avx512vl(auVar43,auVar51);
          auVar46 = vbroadcastss_avx512vl(auVar46);
          auVar51 = vfmadd213ps_avx512vl(auVar45,auVar46,auVar51);
          auVar43 = vmulps_avx512vl(auVar43,auVar52);
          auVar46 = vfmadd213ps_avx512vl(auVar47,auVar46,auVar43);
          auVar40 = vsubss_avx512f(auVar40,auVar44);
          auVar40 = vmaxss_avx(auVar40,auVar72);
          auVar43 = vsubss_avx512f(auVar50,auVar40);
          fVar71 = auVar40._0_4_;
          auVar45._0_4_ = fVar71 * auVar53._0_4_;
          auVar45._4_4_ = fVar71 * auVar53._4_4_;
          auVar45._8_4_ = fVar71 * auVar53._8_4_;
          auVar45._12_4_ = fVar71 * auVar53._12_4_;
          auVar40 = vbroadcastss_avx512vl(auVar43);
          auVar43 = vfmadd213ps_avx512vl(auVar48,auVar40,auVar45);
          auVar44._0_4_ = fVar71 * auVar54._0_4_;
          auVar44._4_4_ = fVar71 * auVar54._4_4_;
          auVar44._8_4_ = fVar71 * auVar54._8_4_;
          auVar44._12_4_ = fVar71 * auVar54._12_4_;
          auVar40 = vfmadd213ps_avx512vl(auVar49,auVar40,auVar44);
          uVar24 = iVar19 + 1;
          if ((int)uVar24 < (int)uVar21) {
            auVar42 = vsubss_avx512f(auVar42,auVar39);
            psVar22 = &pBVar9[uVar24].super_RawBufferView.stride;
            auVar75 = ZEXT1664(auVar75._0_16_);
            auVar73 = ZEXT1664(auVar41);
            do {
              auVar47._0_4_ = (float)(int)uVar24;
              auVar47._4_12_ = auVar62._4_12_;
              auVar41 = vdivss_avx512f(auVar47,ZEXT416((uint)fVar5));
              auVar41 = vsubss_avx512f(auVar41,auVar39);
              auVar41 = vdivss_avx512f(auVar41,auVar42);
              auVar44 = vsubss_avx512f(auVar50,auVar41);
              auVar48._0_4_ = auVar41._0_4_;
              auVar48._4_4_ = auVar48._0_4_;
              auVar48._8_4_ = auVar48._0_4_;
              auVar48._12_4_ = auVar48._0_4_;
              auVar41 = vmulps_avx512vl(auVar43,auVar48);
              auVar49._0_4_ = auVar44._0_4_;
              auVar49._4_4_ = auVar49._0_4_;
              auVar49._8_4_ = auVar49._0_4_;
              auVar49._12_4_ = auVar49._0_4_;
              auVar41 = vfmadd231ps_avx512vl(auVar41,auVar49,auVar51);
              auVar44 = vmulps_avx512vl(auVar40,auVar48);
              auVar44 = vfmadd231ps_avx512vl(auVar44,auVar46,auVar49);
              pcVar10 = ((RawBufferView *)(psVar22 + -2))->ptr_ofs;
              lVar26 = *psVar22 * uVar34;
              lVar28 = *psVar22 * uVar23;
              auVar45 = vminps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar26),
                                        *(undefined1 (*) [16])(pcVar10 + lVar28));
              auVar47 = vmaxps_avx512vl(*(undefined1 (*) [16])(pcVar10 + lVar26),
                                        *(undefined1 (*) [16])(pcVar10 + lVar28));
              auVar48 = vmaxss_avx512f(ZEXT416(*(uint *)(pcVar10 + lVar28 + 0xc)),
                                       ZEXT416(*(uint *)(pcVar10 + lVar26 + 0xc)));
              auVar48 = vmulss_avx512f(auVar74,auVar48);
              auVar48 = vbroadcastss_avx512vl(auVar48);
              auVar45 = vsubps_avx512vl(auVar45,auVar48);
              auVar45 = vsubps_avx512vl(auVar45,auVar41);
              auVar41 = vaddps_avx512vl(auVar47,auVar48);
              auVar41 = vsubps_avx(auVar41,auVar44);
              auVar44 = vminps_avx(auVar45,ZEXT816(0) << 0x40);
              auVar41 = vmaxps_avx(auVar41,ZEXT816(0) << 0x40);
              auVar51 = vaddps_avx512vl(auVar51,auVar44);
              auVar43 = vaddps_avx512vl(auVar43,auVar44);
              auVar46 = vaddps_avx512vl(auVar46,auVar41);
              auVar40 = vaddps_avx512vl(auVar40,auVar41);
              uVar24 = uVar24 + 1;
              psVar22 = psVar22 + 7;
            } while (uVar21 != uVar24);
          }
          else {
            auVar75 = ZEXT1664(auVar75._0_16_);
            auVar73 = ZEXT1664(auVar41);
          }
        }
        aVar16 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx512f(auVar51,auVar75._0_16_,0x30);
        uVar21 = (this->super_LineSegments).super_Geometry.numTimeSteps - 1;
        uVar23 = (ulong)uVar21;
        BVar8 = (this->super_LineSegments).super_Geometry.time_range;
        auVar50._8_8_ = 0;
        auVar50._0_4_ = BVar8.lower;
        auVar50._4_4_ = BVar8.upper;
        aVar17 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx512f(auVar46,ZEXT416((uint)uVar32),0x30);
        auVar41 = vinsertps_avx512f(auVar43,ZEXT416(uVar21),0x30);
        aVar18 = (anon_union_16_2_47237d3f_for_Vec3fx_0)
                 vinsertps_avx512f(auVar40,ZEXT416(uVar21),0x30);
        auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar40 = vmulps_avx512vl(auVar41,auVar39);
        auVar40 = vfmadd231ps_avx512vl(auVar40,(undefined1  [16])aVar16,auVar39);
        auVar42 = vmulps_avx512vl((undefined1  [16])aVar18,auVar39);
        auVar39 = vfmadd231ps_avx512vl(auVar42,(undefined1  [16])aVar17,auVar39);
        auVar40 = vaddps_avx512vl(auVar40,auVar39);
        auVar39 = vminps_avx(auVar57._0_16_,(undefined1  [16])aVar16);
        auVar57 = ZEXT1664(auVar39);
        auVar39 = vmaxps_avx(auVar59._0_16_,(undefined1  [16])aVar17);
        auVar59 = ZEXT1664(auVar39);
        auVar39 = vminps_avx512vl(auVar70._0_16_,auVar41);
        auVar70 = ZEXT1664(auVar39);
        auVar39 = vmaxps_avx512vl(auVar68._0_16_,(undefined1  [16])aVar18);
        auVar68 = ZEXT1664(auVar39);
        auVar39 = vminps_avx512vl(auVar66._0_16_,auVar40);
        auVar66 = ZEXT1664(auVar39);
        auVar39 = vmaxps_avx512vl(auVar64._0_16_,auVar40);
        auVar64 = ZEXT1664(auVar39);
        auVar39 = auVar62._0_16_;
        uVar34 = vcmpps_avx512vl(auVar39,auVar50,1);
        auVar40 = vinsertps_avx512f(auVar39,auVar50,0x50);
        auVar39 = vblendps_avx(auVar50,auVar39,2);
        bVar36 = (bool)((byte)uVar34 & 1);
        bVar12 = (bool)((byte)(uVar34 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar34 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar34 >> 3) & 1);
        auVar62 = ZEXT1664(CONCAT412((uint)bVar14 * auVar40._12_4_ | (uint)!bVar14 * auVar39._12_4_,
                                     CONCAT48((uint)bVar13 * auVar40._8_4_ |
                                              (uint)!bVar13 * auVar39._8_4_,
                                              CONCAT44((uint)bVar12 * auVar40._4_4_ |
                                                       (uint)!bVar12 * auVar39._4_4_,
                                                       (uint)bVar36 * auVar40._0_4_ |
                                                       (uint)!bVar36 * auVar39._0_4_))));
        local_70 = local_70 + 1;
        local_68 = local_68 + uVar23;
        bVar36 = local_78 < uVar23;
        auVar39 = vmovshdup_avx512vl(auVar50);
        auVar60 = ZEXT1664(CONCAT124(auVar60._4_12_,
                                     (uint)bVar36 * auVar39._0_4_ + (uint)!bVar36 * auVar60._0_4_));
        auVar61 = ZEXT1664(CONCAT124(auVar61._4_12_,
                                     (uint)bVar36 * (int)BVar8.lower + (uint)!bVar36 * auVar61._0_4_
                                    ));
        if (local_78 <= uVar23) {
          local_78 = uVar23;
        }
        pPVar11 = prims->items;
        pPVar27 = (PrimInfoMB *)(local_60 * 0x50);
        pPVar11[local_60].lbounds.bounds0.lower.field_0 = aVar16;
        pPVar11[local_60].lbounds.bounds0.upper.field_0 = aVar17;
        *(undefined1 (*) [16])
         ((long)&(pPVar27->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
                 field_0 + (long)&(pPVar11->lbounds).bounds1) = auVar41;
        pPVar11[local_60].lbounds.bounds1.upper.field_0 = aVar18;
        pPVar11[local_60].time_range = BVar8;
        local_60 = local_60 + 1;
      }
LAB_01fb1c13:
      auVar39 = auVar62._0_16_;
      aVar58 = auVar59._0_16_;
      aVar56 = auVar57._0_16_;
      uVar32 = uVar32 + 1;
    } while (uVar32 < r->_end);
    (__return_storage_ptr__->object_range)._end = local_70;
    aVar69 = auVar70._0_16_;
    aVar67 = auVar68._0_16_;
    aVar65 = auVar66._0_16_;
    aVar63 = auVar64._0_16_;
  }
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.lower.
  field_0 = aVar56;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.upper.
  field_0 = aVar58;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.lower.
  field_0 = aVar69;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.upper.
  field_0 = aVar67;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = aVar65;
  (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = aVar63;
  BVar8 = (BBox1f)vmovlps_avx(auVar39);
  __return_storage_ptr__->time_range = BVar8;
  __return_storage_ptr__->num_time_segments = local_68;
  __return_storage_ptr__->max_num_time_segments = local_78;
  (__return_storage_ptr__->max_time_range).lower = auVar61._0_4_;
  (__return_storage_ptr__->max_time_range).upper = auVar60._0_4_;
  return __return_storage_ptr__;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(j, timeSegmentRange(t0t1))) continue;
          const PrimRefMB prim(linearBounds(j,t0t1),this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }